

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagged_union.hpp
# Opt level: O0

void type_safe::detail::
     with_union<type_safe::detail::move_union<type_safe::tagged_union<int,double,debugger_type>>::visitor&&,type_safe::tagged_union<int,double,debugger_type>&&,type_safe::union_types<int,double,debugger_type>,type_safe::tagged_union<int,double,debugger_type>&>
     ::with_impl<double,debugger_type>
               (tagged_union<int,_double,_debugger_type> *param_1,
               tagged_union<int,_double,_debugger_type> *param_2,
               tagged_union<int,_double,_debugger_type> *param_3)

{
  bool bVar1;
  equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id> *lhs;
  union_type<double> local_29;
  tagged_union<int,_double,_debugger_type> *local_28;
  tagged_union<int,_double,_debugger_type> *args_local;
  visitor *func_local;
  tagged_union<int,_double,_debugger_type> *u_local;
  
  local_28 = param_3;
  args_local = param_2;
  func_local = (visitor *)param_1;
  lhs = (equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id> *)
        tagged_union<int,_double,_debugger_type>::type(param_1);
  union_type<double>::union_type(&local_29);
  bVar1 = strong_typedef_op::operator==(lhs,&local_29);
  if (bVar1) {
    with_union<type_safe::detail::move_union<type_safe::tagged_union<int,_double,_debugger_type>_>::visitor_&&,_type_safe::tagged_union<int,_double,_debugger_type>_&&,_type_safe::union_types<int,_double,_debugger_type>,_type_safe::tagged_union<int,_double,_debugger_type>_&>
    ::call<double>(0,(tagged_union<int,_double,_debugger_type> *)func_local,(visitor *)args_local,
                   local_28);
  }
  else {
    with_union<type_safe::detail::move_union<type_safe::tagged_union<int,_double,_debugger_type>_>::visitor_&&,_type_safe::tagged_union<int,_double,_debugger_type>_&&,_type_safe::union_types<int,_double,_debugger_type>,_type_safe::tagged_union<int,_double,_debugger_type>_&>
    ::with_impl<debugger_type>(func_local,args_local,local_28);
  }
  return;
}

Assistant:

static void with_impl(union_types<Head, Tail...>, Union&& u, Func&& func, Args&&... args)
        {
            if (u.type() == union_type<Head>{})
                call<Head>(0, std::forward<Union>(u), std::forward<Func>(func),
                           std::forward<Args>(args)...);
            else
                with_impl(union_types<Tail...>{}, std::forward<Union>(u), std::forward<Func>(func),
                          std::forward<Args>(args)...);
        }